

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = std::__cxx11::string::find((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,0);
  if (uVar1 != 0xffffffffffffffff) {
    uVar3 = uVar1;
    do {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
      std::operator+(&local_b0,&local_70,withThis);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)str);
      std::operator+(&local_50,&local_b0,&local_90);
      std::__cxx11::string::_M_assign((string *)str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      uVar2 = 0xffffffffffffffff;
      if (uVar3 < str->_M_string_length - withThis->_M_string_length) {
        uVar2 = std::__cxx11::string::find
                          ((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,
                           withThis->_M_string_length + uVar3);
      }
      uVar3 = uVar2;
    } while (uVar2 != 0xffffffffffffffff);
  }
  return uVar1 != 0xffffffffffffffff;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }